

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2PrintHandlers.cpp
# Opt level: O3

void __thiscall
SAX2PrintHandlers::endElement(SAX2PrintHandlers *this,XMLCh *uri,XMLCh *localname,XMLCh *qname)

{
  XMLFormatter *this_00;
  XMLFormatter *pXVar1;
  int iVar2;
  
  pXVar1 = &this->fFormatter;
  *(undefined4 *)&this->fFormatter = 0;
  xercesc_4_0::XMLFormatter::operator<<(pXVar1,L"</");
  if ((this->fExpandNS == true) &&
     (iVar2 = xercesc_4_0::XMLString::compareIString
                        (uri,(wchar16 *)&xercesc_4_0::XMLUni::fgZeroLenString), qname = localname,
     iVar2 != 0)) {
    this_00 = (XMLFormatter *)xercesc_4_0::XMLFormatter::operator<<(pXVar1,uri);
    xercesc_4_0::XMLFormatter::operator<<(this_00,L':');
  }
  pXVar1 = (XMLFormatter *)xercesc_4_0::XMLFormatter::operator<<(pXVar1,qname);
  xercesc_4_0::XMLFormatter::operator<<(pXVar1,L'>');
  return;
}

Assistant:

void SAX2PrintHandlers::endElement(const XMLCh* const uri,
								 const XMLCh* const localname,
								 const XMLCh* const qname)
{
    // No escapes are legal here
    fFormatter << XMLFormatter::NoEscapes << gEndElement ;
	if ( fExpandNS )
	{
		if (XMLString::compareIString(uri,XMLUni::fgZeroLenString) != 0)
				fFormatter  << uri << chColon;
		fFormatter << localname << chCloseAngle;
	}
	else
		fFormatter << qname << chCloseAngle;
}